

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::BlindTransactionWithDirectKey
          (ConfidentialTransactionContext *this,
          map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
          *utxo_info_map,
          map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
          *issuance_key_map,
          vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
          *confidential_address_list,
          vector<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
          *confidential_key_list,int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *blinder_list)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  pointer pEVar3;
  pointer pCVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  iterator iVar9;
  pointer __dest;
  size_t __n;
  const_iterator __begin2;
  pointer pCVar10;
  pointer pCVar11;
  ulong uVar12;
  pointer this_00;
  pointer this_01;
  long lVar13;
  pointer this_02;
  ulong uVar14;
  long lVar15;
  ByteData nonce;
  ByteData local_2a8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> confidential_keys;
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  issuance_blinding_keys;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> txin_info_list;
  string script;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ct_map;
  ConfidentialKey local_1c0;
  undefined1 local_1a8 [8];
  pointer puStack_1a0;
  _Alloc_hider local_198;
  char local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  txin_info_list.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((utxo_info_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::resize
              (&txin_info_list,
               ((long)(this->super_ConfidentialTransaction).vin_.
                      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_ConfidentialTransaction).vin_.
                      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3);
    for (p_Var8 = (utxo_info_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(utxo_info_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      uVar7 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[0xf])(this,p_Var8 + 1);
      this_00 = txin_info_list.
                super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar7;
      core::ConfidentialAssetId::operator=
                (&this_00->asset,(ConfidentialAssetId *)&p_Var8[2]._M_parent);
      core::BlindFactor::operator=(&this_00->abf,(BlindFactor *)&p_Var8[3]._M_left);
      core::BlindFactor::operator=(&this_00->vbf,(BlindFactor *)&p_Var8[4]._M_left);
      core::ConfidentialValue::operator=(&this_00->value,(ConfidentialValue *)&p_Var8[5]._M_left);
    }
  }
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  issuance_blinding_keys.
  super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((issuance_key_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
    ::resize(&issuance_blinding_keys,
             ((long)(this->super_ConfidentialTransaction).vin_.
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_ConfidentialTransaction).vin_.
                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3);
    for (p_Var8 = (issuance_key_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(issuance_key_map->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      uVar7 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                _vptr_AbstractTransaction[0xf])(this,p_Var8 + 1);
      this_02 = issuance_blinding_keys.
                super__Vector_base<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar7;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[2]._M_parent);
      uVar2 = *(undefined8 *)(p_Var8 + 3);
      (this_02->asset_key).is_compressed_ = (bool)(char)uVar2;
      *(int3 *)&(this_02->asset_key).field_0x19 = (int3)((ulong)uVar2 >> 8);
      (this_02->asset_key).net_type_ = (int)((ulong)uVar2 >> 0x20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this_02->token_key,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[3]._M_parent);
      uVar2 = *(undefined8 *)(p_Var8 + 4);
      (this_02->token_key).is_compressed_ = (bool)(char)uVar2;
      *(int3 *)&(this_02->token_key).field_0x19 = (int3)((ulong)uVar2 >> 8);
      (this_02->token_key).net_type_ = (int)((ulong)uVar2 >> 0x20);
    }
  }
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&confidential_keys,
             ((long)(this->super_ConfidentialTransaction).vout_.
                    super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->super_ConfidentialTransaction).vout_.
                    super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421,
             (allocator_type *)local_1a8);
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ct_map._M_t._M_impl.super__Rb_tree_header._M_header;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = (confidential_address_list->
            super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (confidential_address_list->
           super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ct_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this_01 != pEVar3) {
    do {
      core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_1a8,this_01);
      core::Address::GetLockingScript((Script *)&script,(Address *)local_1a8);
      core::Script::GetHex_abi_cxx11_((string *)&nonce,(Script *)&script);
      core::ElementsConfidentialAddress::GetConfidentialKey(&local_1c0,this_01);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Pubkey>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>
      ::_M_emplace_unique<std::__cxx11::string_const,cfd::core::Pubkey>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Pubkey>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Pubkey>>>
                  *)&ct_map,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nonce,
                 &local_1c0);
      if (local_1c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((pointer *)
          nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(nonce.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::Script::~Script((Script *)&script);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      core::Script::~Script(&local_a0);
      local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_b8);
      core::TapBranch::~TapBranch(&local_130);
      if (local_148 != (pointer)0x0) {
        operator_delete(local_148);
      }
      if (local_160 != (pointer)0x0) {
        operator_delete(local_160);
      }
      if (local_178 != (pointer)0x0) {
        operator_delete(local_178);
      }
      if (local_198._M_p != local_188) {
        operator_delete(local_198._M_p);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pEVar3);
  }
  pCVar4 = (confidential_key_list->
           super__Vector_base<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar10 = (confidential_key_list->
                 super__Vector_base<cfd::ConfidentialKeyBlindParameter,_std::allocator<cfd::ConfidentialKeyBlindParameter>_>
                 )._M_impl.super__Vector_impl_data._M_start; pCVar10 != pCVar4;
      pCVar10 = pCVar10 + 1) {
    if (pCVar10->index <
        (uint)((int)((ulong)((long)(this->super_ConfidentialTransaction).vout_.
                                   super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->super_ConfidentialTransaction).vout_.
                                  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x42108421)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 (confidential_keys.
                  super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
                  super__Vector_impl_data._M_start + pCVar10->index),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pCVar10->confidential_key
                );
    }
  }
  pCVar11 = (this->super_ConfidentialTransaction).vout_.
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->super_ConfidentialTransaction).vout_.
                          super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11) >> 3) *
      -0x42108421 != 0) {
    lVar13 = 0xa0;
    lVar15 = 0;
    uVar14 = 0;
    do {
      core::AbstractTxOut::GetLockingScript
                ((Script *)local_1a8,(AbstractTxOut *)((long)pCVar11 + lVar13 + -0xa0));
      core::Script::GetHex_abi_cxx11_(&script,(Script *)local_1a8);
      core::Script::~Script((Script *)local_1a8);
      bVar6 = core::Pubkey::IsValid
                        ((Pubkey *)
                         ((long)&((confidential_keys.
                                   super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar15));
      if (!bVar6) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                ::find(&ct_map._M_t,&script);
        if ((_Rb_tree_header *)iVar9._M_node == &ct_map._M_t._M_impl.super__Rb_tree_header) {
          core::ConfidentialNonce::ConfidentialNonce
                    ((ConfidentialNonce *)local_1a8,
                     (ConfidentialNonce *)
                     ((long)&(pCVar11->super_AbstractTxOut)._vptr_AbstractTxOut + lVar13));
          core::ConfidentialNonce::GetData(&nonce,(ConfidentialNonce *)local_1a8);
          local_1a8 = (undefined1  [8])&PTR__ConfidentialNonce_00723710;
          if (puStack_1a0 != (pointer)0x0) {
            operator_delete(puStack_1a0);
          }
          bVar6 = core::Pubkey::IsValid(&nonce);
          if (bVar6) {
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar12 = (long)nonce.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)nonce.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
            if (uVar12 == 0) {
              __dest = (pointer)0x0;
              __n = 0;
            }
            else {
              if ((long)uVar12 < 0) {
                std::__throw_bad_alloc();
              }
              __dest = (pointer)operator_new(uVar12);
              __n = (long)nonce.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)nonce.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            }
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar12;
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = __dest;
            if (nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = __dest;
              memmove(__dest,nonce.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,__n);
            }
            local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
            core::Pubkey::Pubkey((Pubkey *)local_1a8,&local_2a8);
            pvVar5 = *(void **)((long)&((confidential_keys.
                                         super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar15);
            puVar1 = (undefined8 *)
                     ((long)&((confidential_keys.
                               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                               ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar15);
            *puVar1 = local_1a8;
            puVar1[1] = puStack_1a0;
            *(pointer *)
             ((long)&((confidential_keys.
                       super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data_).data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + lVar15) = local_198._M_p;
            local_1a8 = (undefined1  [8])0x0;
            puStack_1a0 = (pointer)0x0;
            local_198._M_p = (char *)0x0;
            if ((pvVar5 != (void *)0x0) &&
               (operator_delete(pvVar5), local_1a8 != (undefined1  [8])0x0)) {
              operator_delete((void *)local_1a8);
            }
            if (local_2a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (nonce.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(nonce.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
                  ::find(&ct_map._M_t,&script);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)&((confidential_keys.
                               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
                               ._M_impl.super__Vector_impl_data._M_start)->data_).data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar15),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(iVar9._M_node + 2));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)script._M_dataplus._M_p != &script.field_2) {
        operator_delete(script._M_dataplus._M_p);
      }
      uVar14 = uVar14 + 1;
      pCVar11 = (this->super_ConfidentialTransaction).vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0xf8;
      lVar15 = lVar15 + 0x18;
    } while (uVar14 < (uint)((int)((ulong)((long)(this->super_ConfidentialTransaction).vout_.
                                                 super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pCVar11) >> 3) * -0x42108421));
  }
  core::ConfidentialTransaction::BlindTransaction
            (&this->super_ConfidentialTransaction,&txin_info_list,&issuance_blinding_keys,
             &confidential_keys,minimum_range_value,exponent,minimum_bits,blinder_list);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Pubkey>_>_>
  ::~_Rb_tree(&ct_map._M_t);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&confidential_keys);
  std::
  vector<cfd::core::IssuanceBlindingKeyPair,_std::allocator<cfd::core::IssuanceBlindingKeyPair>_>::
  ~vector(&issuance_blinding_keys);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&txin_info_list);
  return;
}

Assistant:

void ConfidentialTransactionContext::BlindTransactionWithDirectKey(
    const std::map<OutPoint, BlindParameter>& utxo_info_map,
    const std::map<OutPoint, IssuanceBlindingKeyPair>& issuance_key_map,
    const std::vector<ElementsConfidentialAddress>& confidential_address_list,
    const std::vector<ConfidentialKeyBlindParameter>& confidential_key_list,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<BlindData>* blinder_list) {
  uint32_t index = 0;
  std::vector<BlindParameter> txin_info_list;
  if (!utxo_info_map.empty()) {
    txin_info_list.resize(vin_.size());
    for (const auto& utxo_info : utxo_info_map) {
      index = GetTxInIndex(utxo_info.first);
      txin_info_list[index] = utxo_info.second;
    }
  }

  std::vector<IssuanceBlindingKeyPair> issuance_blinding_keys;
  if (!issuance_key_map.empty()) {
    issuance_blinding_keys.resize(vin_.size());
    for (const auto& key_info : issuance_key_map) {
      index = GetTxInIndex(key_info.first);
      issuance_blinding_keys[index] = key_info.second;
    }
  }

  std::vector<Pubkey> confidential_keys(vout_.size());
  std::map<std::string, Pubkey> ct_map;
  if (!confidential_address_list.empty()) {
    for (const auto& ct_addr : confidential_address_list) {
      ct_map.emplace(
          ct_addr.GetUnblindedAddress().GetLockingScript().GetHex(),
          ct_addr.GetConfidentialKey());
    }
  }
  if (!confidential_key_list.empty()) {
    for (const auto& data : confidential_key_list) {
      if (data.index < static_cast<uint32_t>(vout_.size())) {
        confidential_keys[data.index] = data.confidential_key;
      }
    }
  }
  for (index = 0; index < static_cast<uint32_t>(vout_.size()); ++index) {
    const auto& txout = vout_[index];
    std::string script = txout.GetLockingScript().GetHex();
    if (confidential_keys[index].IsValid()) {
      // do nothing
    } else if (ct_map.find(script) != std::end(ct_map)) {
      confidential_keys[index] = ct_map.find(script)->second;
    } else {
      ByteData nonce = txout.GetNonce().GetData();
      if (Pubkey::IsValid(nonce)) {
        confidential_keys[index] = Pubkey(nonce);
      }
    }
  }

  BlindTransaction(
      txin_info_list, issuance_blinding_keys, confidential_keys,
      minimum_range_value, exponent, minimum_bits, blinder_list);
}